

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  sqlite3_value *pVal;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  uchar **p;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  char *local_50;
  
  pVal = *argv;
  uVar3._0_2_ = pVal->flags;
  uVar3._2_1_ = pVal->enc;
  uVar3._3_1_ = pVal->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
    uVar7 = 1;
    local_50 = (char *)sqlite3ValueText(pVal,'\x01');
    if (local_50 != (char *)0x0) {
      uVar3 = sqlite3ValueBytes(*argv,'\x01');
      if (argc == 1) {
        p = trimFunc::azOne;
        puVar8 = trimFunc::lenOne;
LAB_001b667b:
        if (0 < (int)uVar7) {
          pvVar2 = context->pFunc->pUserData;
          if ((uVar3 != 0 & (byte)pvVar2) == 1) {
            do {
              bVar12 = true;
              uVar11 = 1;
              do {
                uVar9 = *(uint *)((long)puVar8 + uVar11 * 4 + -4);
                uVar10 = (ulong)uVar9;
                if ((uVar9 <= uVar3) && (iVar4 = bcmp(local_50,p[uVar11 - 1],uVar10), iVar4 == 0))
                goto LAB_001b6719;
                bVar12 = uVar11 < (uVar7 & 0xffffffff);
                bVar13 = uVar11 != (uVar7 & 0xffffffff);
                uVar11 = uVar11 + 1;
              } while (bVar13);
              uVar10 = 0;
LAB_001b6719:
              uVar3 = uVar3 - (int)uVar10;
              local_50 = local_50 + uVar10;
              if (!bVar12) goto LAB_001b673f;
            } while (uVar3 != 0);
            uVar3 = 0;
          }
LAB_001b673f:
          if ((((ulong)pvVar2 & 2) != 0) && (uVar3 != 0)) {
            uVar11 = 1;
            if (1 < (int)uVar7) {
              uVar11 = uVar7 & 0xffffffff;
            }
            do {
              bVar12 = true;
              uVar10 = 1;
              do {
                uVar9 = *(uint *)((long)puVar8 + uVar10 * 4 + -4);
                if ((uVar9 <= uVar3) &&
                   (iVar4 = bcmp(local_50 + (uVar3 - uVar9),p[uVar10 - 1],(ulong)uVar9), iVar4 == 0)
                   ) goto LAB_001b67c6;
                bVar12 = uVar10 < (uVar7 & 0xffffffff);
                bVar13 = uVar10 != uVar11;
                uVar10 = uVar10 + 1;
              } while (bVar13);
              uVar9 = 0;
LAB_001b67c6:
              uVar3 = uVar3 - uVar9;
              if (!bVar12) goto LAB_001b67df;
            } while (uVar3 != 0);
            uVar3 = 0;
          }
LAB_001b67df:
          if (argc != 1) {
            sqlite3_free(p);
          }
        }
        setResultStrOrError(context,local_50,uVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
        ;
        return;
      }
      puVar5 = (uchar *)sqlite3ValueText(argv[1],'\x01');
      if (puVar5 != (uchar *)0x0) {
        uVar7 = 0;
        uVar1 = *puVar5;
        puVar6 = puVar5;
        while (uVar1 != '\0') {
          puVar6 = puVar6 + 1;
          uVar7 = (ulong)((int)uVar7 + 1);
          uVar1 = *puVar6;
        }
        bVar12 = true;
        if ((int)uVar7 == 0) {
          puVar8 = (uint *)0x0;
          p = (uchar **)0x0;
        }
        else {
          p = (uchar **)contextMalloc(context,uVar7 * 0xc);
          puVar8 = (uint *)0x0;
          if (p == (uchar **)0x0) {
            p = (uchar **)0x0;
            bVar12 = false;
          }
          else {
            puVar8 = (uint *)(p + uVar7);
            if (*puVar5 == '\0') {
              uVar7 = 0;
            }
            else {
              uVar7 = 0;
              do {
                p[uVar7] = puVar5;
                puVar6 = puVar5 + 1;
                *(int *)((long)puVar8 + uVar7 * 4) = (int)puVar6 - (int)puVar5;
                uVar7 = uVar7 + 1;
                puVar5 = puVar6;
              } while (*puVar6 != '\0');
            }
            bVar12 = true;
          }
        }
        if (bVar12) goto LAB_001b667b;
      }
    }
  }
  return;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  unsigned int nIn;                 /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned int *aLen = 0;           /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = (unsigned)sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (unsigned*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context,
                     ((i64)nChar)*(sizeof(char*)+sizeof(unsigned)));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (unsigned)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}